

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

DdNode * Llb_Nonlin4ComputeCube
                   (DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,char *pValues,int Flag)

{
  abctime aVar1;
  int iVar2;
  DdNode *n;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj;
  DdNode *pDVar4;
  int i;
  Aig_Obj_t *pObj_00;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (i = 0; i < pAig->nRegs; i = i + 1) {
    pAVar3 = Saig_ManLi(pAig,i);
    pObj = Saig_ManLo(pAig,i);
    pObj_00 = pAVar3;
    if (Flag == 0) {
      pObj_00 = pObj;
      pObj = pAVar3;
    }
    iVar2 = Llb_ObjBddVar(vOrder,pObj);
    pDVar4 = Cudd_bddIthVar(dd,iVar2);
    iVar2 = Llb_ObjBddVar(vOrder,pObj_00);
    if (pValues[iVar2] != '\x01') {
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
    }
    pDVar4 = Cudd_bddAnd(dd,n,pDVar4);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar4;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return n;
}

Assistant:

DdNode * Llb_Nonlin4ComputeCube( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, char * pValues, int Flag )
{
    Aig_Obj_t * pObjLo, * pObjLi, * pObjTemp;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        if ( Flag )
            pObjTemp = pObjLo, pObjLo = pObjLi, pObjLi = pObjTemp;
        // get the correspoding flop input variable
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLi) );
        if ( pValues[Llb_ObjBddVar(vOrder, pObjLo)] != 1 )
            bVar = Cudd_Not(bVar);
        // create cube
        bRes = Cudd_bddAnd( dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}